

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_compilation.cpp
# Opt level: O2

void __thiscall
pstore::exchange::import_ns::definition::definition
          (definition *this,not_null<context_*> ctxt,not_null<container_*> definitions,
          not_null<const_string_mapping_*> names,fragment_index_pointer *fragments)

{
  (this->super_rule).context_.ptr_ = ctxt.ptr_;
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__definition_00166938;
  (this->definitions_).ptr_ = definitions.ptr_;
  (this->names_).ptr_ = names.ptr_;
  std::
  __shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&(this->fragments_).
                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                 ,&fragments->
                   super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  (this->seen_).super__Base_bitset<1UL>._M_w = 0;
  (this->digest_)._M_dataplus._M_p = (pointer)&(this->digest_).field_2;
  (this->digest_)._M_string_length = 0;
  (this->digest_).field_2._M_local_buf[0] = '\0';
  this->name_ = 0;
  (this->linkage_)._M_dataplus._M_p = (pointer)&(this->linkage_).field_2;
  (this->linkage_)._M_string_length = 0;
  (this->linkage_).field_2._M_local_buf[0] = '\0';
  (this->visibility_)._M_dataplus._M_p = (pointer)&(this->visibility_).field_2;
  (this->visibility_)._M_string_length = 0;
  (this->visibility_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

definition::definition (not_null<context *> const ctxt,
                                    not_null<container *> const definitions,
                                    not_null<string_mapping const *> const names,
                                    fragment_index_pointer const & fragments)
                    : rule (ctxt)
                    , definitions_{definitions}
                    , names_{names}
                    , fragments_{fragments} {}